

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O1

ngx_int_t ngx_radix128tree_delete(ngx_radix_tree_t *tree,u_char *key,u_char *mask)

{
  uint uVar1;
  ngx_int_t nVar2;
  ngx_radix_node_t *pnVar3;
  ngx_radix_node_t *pnVar4;
  ngx_radix_node_t *pnVar5;
  long lVar6;
  
  pnVar3 = tree->root;
  if (pnVar3 != (ngx_radix_node_t *)0x0) {
    uVar1 = 0x80;
    lVar6 = 0;
    do {
      if ((uVar1 & mask[lVar6]) == 0) goto LAB_0011e00e;
      pnVar3 = (&pnVar3->right)[(uVar1 & key[lVar6]) == 0];
      uVar1 = uVar1 >> 1;
      if (uVar1 == 0) {
        lVar6 = lVar6 + 1;
        uVar1 = 0x80;
        if (lVar6 == 0x10) goto LAB_0011e00e;
      }
    } while (pnVar3 != (ngx_radix_node_t *)0x0);
  }
  pnVar3 = (ngx_radix_node_t *)0x0;
LAB_0011e00e:
  nVar2 = -1;
  if (pnVar3 != (ngx_radix_node_t *)0x0) {
    if ((pnVar3->right == (ngx_radix_node_t *)0x0) && (pnVar3->left == (ngx_radix_node_t *)0x0)) {
      pnVar5 = tree->free;
      do {
        pnVar4 = pnVar3;
        pnVar3 = pnVar4->parent;
        (&pnVar3->right)[pnVar3->right != pnVar4] = (ngx_radix_node_t *)0x0;
        pnVar4->right = pnVar5;
        if (((pnVar3->right != (ngx_radix_node_t *)0x0) || (pnVar3->left != (ngx_radix_node_t *)0x0)
            ) || (pnVar3->value != 0xffffffffffffffff)) break;
        pnVar5 = pnVar4;
      } while (pnVar3->parent != (ngx_radix_node_t *)0x0);
      tree->free = pnVar4;
    }
    else {
      if (pnVar3->value == 0xffffffffffffffff) {
        return -1;
      }
      pnVar3->value = 0xffffffffffffffff;
    }
    nVar2 = 0;
  }
  return nVar2;
}

Assistant:

ngx_int_t
ngx_radix128tree_delete(ngx_radix_tree_t *tree, u_char *key, u_char *mask)
{
    u_char             bit;
    ngx_uint_t         i;
    ngx_radix_node_t  *node;

    i = 0;
    bit = 0x80;
    node = tree->root;

    while (node && (bit & mask[i])) {
        if (key[i] & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    if (node == NULL) {
        return NGX_ERROR;
    }

    if (node->right || node->left) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            node->value = NGX_RADIX_NO_VALUE;
            return NGX_OK;
        }

        return NGX_ERROR;
    }

    for ( ;; ) {
        if (node->parent->right == node) {
            node->parent->right = NULL;

        } else {
            node->parent->left = NULL;
        }

        node->right = tree->free;
        tree->free = node;

        node = node->parent;

        if (node->right || node->left) {
            break;
        }

        if (node->value != NGX_RADIX_NO_VALUE) {
            break;
        }

        if (node->parent == NULL) {
            break;
        }
    }

    return NGX_OK;
}